

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.cpp
# Opt level: O1

string * __thiscall
OpenMD::LipidHeadVisitor::toString_abi_cxx11_(string *__return_storage_ptr__,LipidHeadVisitor *this)

{
  _Rb_tree_node_base *p_Var1;
  char buffer [65535];
  undefined8 uStack_10038;
  char acStack_10030 [16];
  undefined2 uStack_10020;
  undefined6 uStack_1001e;
  undefined2 uStack_10018;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  memcpy(&uStack_10038,"------------------------------------------------------------------\n",0x44);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf((char *)&uStack_10038,0xffff,"Visitor name: %s\n",
           (this->super_BaseRigidBodyVisitor).super_BaseVisitor.visitorName._M_dataplus._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uStack_10018 = 0x2077;
  builtin_strncpy(acStack_10030 + 8,"st conta",8);
  uStack_10020 = 0x6e69;
  uStack_1001e = 0x6f6c65622073;
  uStack_10038._0_1_ = 'l';
  uStack_10038._1_1_ = 'i';
  uStack_10038._2_1_ = 'p';
  uStack_10038._3_1_ = 'i';
  uStack_10038._4_1_ = 'd';
  uStack_10038._5_1_ = 'H';
  uStack_10038._6_1_ = 'e';
  uStack_10038._7_1_ = 'a';
  builtin_strncpy(acStack_10030,"dName li",8);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  for (p_Var1 = (this->lipidHeadName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->lipidHeadName)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    snprintf((char *)&uStack_10038,0xffff,"%s\t",*(undefined8 *)(p_Var1 + 1));
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  uStack_10038 = CONCAT62(uStack_10038._2_6_,10);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  memcpy(&uStack_10038,"------------------------------------------------------------------\n",0x44);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string LipidHeadVisitor::toString() {
    char buffer[65535];
    std::string result;
    std::set<std::string>::iterator i;

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    snprintf(buffer, 65535, "Visitor name: %s\n", visitorName.c_str());
    result += buffer;

    // print the ignore type list
    snprintf(buffer, 65535, "lipidHeadName list contains below types:\n");
    result += buffer;

    for (i = lipidHeadName.begin(); i != lipidHeadName.end(); ++i) {
      snprintf(buffer, 65535, "%s\t", i->c_str());
      result += buffer;
    }

    snprintf(buffer, 65535, "\n");
    result += buffer;

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    return result;
  }